

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O1

int ffpss(fitsfile *fptr,int datatype,long *blc,long *trc,void *array,int *status)

{
  int naxis;
  long naxes [9];
  
  if (0 < *status) {
    return *status;
  }
  ffgidm(fptr,&naxis,status);
  ffgisz(fptr,9,naxes,status);
  if (datatype < 0x28) {
    if (datatype < 0x15) {
      if (datatype == 0xb) {
        ffpssb(fptr,1,(long)naxis,naxes,blc,trc,(uchar *)array,status);
        goto LAB_001a5ec2;
      }
      if (datatype == 0xc) {
        ffpsssb(fptr,1,(long)naxis,naxes,blc,trc,(char *)array,status);
        goto LAB_001a5ec2;
      }
      if (datatype == 0x14) {
        ffpssui(fptr,1,(long)naxis,naxes,blc,trc,(unsigned_short *)array,status);
        goto LAB_001a5ec2;
      }
    }
    else {
      if (datatype == 0x15) {
        ffpssi(fptr,1,(long)naxis,naxes,blc,trc,(short *)array,status);
        goto LAB_001a5ec2;
      }
      if (datatype == 0x1e) {
        ffpssuk(fptr,1,(long)naxis,naxes,blc,trc,(uint *)array,status);
        goto LAB_001a5ec2;
      }
      if (datatype == 0x1f) {
        ffpssk(fptr,1,(long)naxis,naxes,blc,trc,(int *)array,status);
        goto LAB_001a5ec2;
      }
    }
  }
  else if (datatype < 0x50) {
    if (datatype == 0x28) {
      ffpssuj(fptr,1,(long)naxis,naxes,blc,trc,(unsigned_long *)array,status);
      goto LAB_001a5ec2;
    }
    if (datatype == 0x29) {
      ffpssj(fptr,1,(long)naxis,naxes,blc,trc,(long *)array,status);
      goto LAB_001a5ec2;
    }
    if (datatype == 0x2a) {
      ffpsse(fptr,1,(long)naxis,naxes,blc,trc,(float *)array,status);
      goto LAB_001a5ec2;
    }
  }
  else {
    if (datatype == 0x50) {
      ffpssujj(fptr,1,(long)naxis,naxes,blc,trc,(ULONGLONG *)array,status);
      goto LAB_001a5ec2;
    }
    if (datatype == 0x51) {
      ffpssjj(fptr,1,(long)naxis,naxes,blc,trc,(LONGLONG *)array,status);
      goto LAB_001a5ec2;
    }
    if (datatype == 0x52) {
      ffpssd(fptr,1,(long)naxis,naxes,blc,trc,(double *)array,status);
      goto LAB_001a5ec2;
    }
  }
  *status = 0x19a;
LAB_001a5ec2:
  return *status;
}

Assistant:

int ffpss(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *blc,        /* I - 'bottom left corner' of the subsection  */
            long *trc ,       /* I - 'top right corner' of the subsection    */
            void *array,      /* I - array of values that are written        */
            int  *status)     /* IO - error status                           */
/*
  Write a section of values to the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).

  This routine supports writing to large images with
  more than 2**31 pixels.
*/
{
    int naxis;
    long naxes[9];

    if (*status > 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, 9, naxes, status);

    if (datatype == TBYTE)
    {
        ffpssb(fptr, 1, naxis, naxes, blc, trc,
               (unsigned char *) array, status);
    }
    else if (datatype == TSBYTE)
    {
        ffpsssb(fptr, 1, naxis, naxes, blc, trc,
               (signed char *) array, status);
    }
    else if (datatype == TUSHORT)
    {
        ffpssui(fptr, 1, naxis, naxes, blc, trc,
               (unsigned short *) array, status);
    }
    else if (datatype == TSHORT)
    {
        ffpssi(fptr, 1, naxis, naxes, blc, trc,
               (short *) array, status);
    }
    else if (datatype == TUINT)
    {
        ffpssuk(fptr, 1, naxis, naxes, blc, trc,
               (unsigned int *) array, status);
    }
    else if (datatype == TINT)
    {
        ffpssk(fptr, 1, naxis, naxes, blc, trc,
               (int *) array, status);
    }
    else if (datatype == TULONG)
    {
        ffpssuj(fptr, 1, naxis, naxes, blc, trc,
               (unsigned long *) array, status);
    }
    else if (datatype == TLONG)
    {
        ffpssj(fptr, 1, naxis, naxes, blc, trc,
               (long *) array, status);
    }
    else if (datatype == TULONGLONG)
    {
        ffpssujj(fptr, 1, naxis, naxes, blc, trc,
               (ULONGLONG *) array, status);
    }
    else if (datatype == TLONGLONG)
    {
        ffpssjj(fptr, 1, naxis, naxes, blc, trc,
               (LONGLONG *) array, status);
    }    
    else if (datatype == TFLOAT)
    {
        ffpsse(fptr, 1, naxis, naxes, blc, trc,
               (float *) array, status);
    }
    else if (datatype == TDOUBLE)
    {
        ffpssd(fptr, 1, naxis, naxes, blc, trc,
               (double *) array, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}